

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader14.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::MeshLoader14::begin__lines(MeshLoader14 *this,lines__AttributeData *attributeData)

{
  byte bVar1;
  uint *in_RSI;
  long in_RDI;
  bool bVar2;
  lines__AttributeData attrData;
  uint local_30 [2];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_28 = *(undefined8 *)(in_RSI + 2);
  local_18 = *(undefined8 *)(in_RSI + 6);
  bVar2 = (*in_RSI & 1) == 1;
  if (bVar2) {
    local_20 = *(undefined8 *)(in_RSI + 4);
  }
  local_30[0] = (uint)bVar2;
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x140))(*(long **)(in_RDI + 0x20),local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool MeshLoader14::begin__lines( const COLLADASaxFWL14::lines__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__lines(attributeData));
COLLADASaxFWL::lines__AttributeData attrData;
attrData.present_attributes = 0;
attrData.name = attributeData.name;
attrData.material = attributeData.material;
if ( (attributeData.present_attributes & COLLADASaxFWL14::lines__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL14::lines__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::lines__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__lines(attrData);
}